

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_resize_clear(X,((buflen >> 3) + 1) - (ulong)((buflen & 7) == 0));
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mbedtls_mpi_core_read_le(X->p,(ulong)X->n,buf,buflen);
  return iVar1;
}

Assistant:

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,
                               const unsigned char *buf, size_t buflen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(buflen);

    /* Ensure that target MPI has exactly the necessary number of limbs */
    MBEDTLS_MPI_CHK(mbedtls_mpi_resize_clear(X, limbs));

    MBEDTLS_MPI_CHK(mbedtls_mpi_core_read_le(X->p, X->n, buf, buflen));

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return ret;
}